

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::insertconstrainedpoints(tetgenmesh *this,point *insertarray,int arylen,int rejflag)

{
  ulong uVar1;
  tetrahedron *pppdVar2;
  point pdVar3;
  double *pdVar4;
  int iVar5;
  arraypool *paVar6;
  tetrahedron *pppdVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  face splitsh;
  triface searchtet;
  face splitseg;
  int ngroup;
  insertvertexflags ivf;
  flipconstraints fc;
  int local_184;
  face local_180;
  triface local_170;
  face local_160;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  ulong local_128;
  int local_11c;
  insertvertexflags local_118;
  flipconstraints local_a8;
  
  local_170.tet = (tetrahedron *)0x0;
  local_170.ver = 0;
  local_180.sh = (shellface *)0x0;
  local_180.shver = 0;
  local_160.sh = (shellface *)0x0;
  local_160.shver = 0;
  local_118.refinetet.tet = (tetrahedron *)0x0;
  local_118.refinetet.ver = 0;
  local_118.refinesh.sh = (shellface *)0x0;
  local_118.refinesh.shver = 0;
  local_118.smlenflag = 0;
  local_118.smlen = 0.0;
  local_118.iloc = 0;
  local_118.bowywat = 0;
  local_118.lawson = 0;
  local_118.splitbdflag = 0;
  local_118.validflag = 0;
  local_118.respectbdflag = 0;
  local_118.rejflag = 0;
  local_118.chkencflag = 0;
  local_118.cdtflag = 0;
  local_118.assignmeshsize = 0;
  local_118.sloc = 0;
  local_118.sbowywat = 0;
  local_118.refineflag = 0;
  local_a8.seg[0] = (point)0x0;
  local_a8.fac[0] = (point)0x0;
  local_a8.remvert = (point)0x0;
  local_a8.enqflag = 0;
  local_a8.chkencflag = 0;
  local_a8.unflip = 0;
  local_a8.collectnewtets = 0;
  local_a8.collectencsegflag = 0;
  local_a8.remove_ndelaunay_edge = 0;
  local_a8.bak_tetprism_vol._0_4_ = 0;
  local_a8.bak_tetprism_vol._4_4_ = 0;
  local_a8.tetprism_vol_sum._0_4_ = 0;
  local_a8._36_8_ = 0;
  local_a8.cosdihed_in = 0.0;
  local_a8.cosdihed_out = 0.0;
  local_a8.checkflipeligibility = 0;
  if (this->b->verbose != 0) {
    printf("  Inserting %d constrained points\n",(ulong)(uint)arylen);
  }
  iVar5 = this->b->verbose;
  if (this->b->no_sort == 0) {
    if (iVar5 != 0) {
      puts("  Permuting vertices.");
    }
    srand(arylen);
    if (0 < arylen) {
      uVar9 = 0;
      do {
        iVar5 = rand();
        uVar1 = uVar9 + 1;
        iVar5 = iVar5 % (int)uVar1;
        pdVar3 = insertarray[uVar9];
        insertarray[uVar9] = insertarray[iVar5];
        insertarray[iVar5] = pdVar3;
        uVar9 = uVar1;
      } while ((uint)arylen != uVar1);
    }
    if (this->b->brio_hilbert == 0) {
      local_184 = 1;
    }
    else {
      if (this->b->verbose != 0) {
        puts("  Sorting vertices.");
      }
      hilbert_init(this,this->in->mesh_dim);
      local_11c = 0;
      brio_multiscale_sort
                (this,insertarray,arylen,this->b->brio_threshold,this->b->brio_ratio,&local_11c);
      local_184 = 0;
    }
  }
  else {
    local_184 = 0;
    if (iVar5 != 0) {
      puts("  Using the input order.");
    }
  }
  local_130 = this->nonregularcount;
  this->nonregularcount = 0;
  local_138 = this->samples;
  this->samples = 3;
  bVar10 = this->b->incrflip == 0;
  if (!bVar10) {
    local_a8.enqflag = 2;
  }
  local_118.validflag = (int)bVar10;
  local_118.lawson = (int)!bVar10;
  local_118.bowywat = (int)bVar10;
  local_150 = this->st_segref_count;
  local_148 = this->st_facref_count;
  local_140 = this->st_volref_count;
  local_118.chkencflag = 0;
  local_118.rejflag = rejflag;
  local_118.sloc = 0xb;
  local_118.sbowywat = 3;
  local_118.splitbdflag = 1;
  local_118.respectbdflag = 1;
  local_118.assignmeshsize = this->b->metric;
  paVar6 = (arraypool *)operator_new(0x30);
  paVar6->objectbytes = 0x10;
  paVar6->objectsperblock = 0x100;
  paVar6->log2objectsperblock = 8;
  paVar6->objectsperblockmark = 0xff;
  paVar6->toparraylen = 0;
  paVar6->toparray = (char **)0x0;
  paVar6->objects = 0;
  paVar6->totalmemory = 0;
  this->encseglist = paVar6;
  paVar6 = (arraypool *)operator_new(0x30);
  paVar6->objectbytes = 0x88;
  paVar6->objectsperblock = 0x100;
  paVar6->log2objectsperblock = 8;
  paVar6->objectsperblockmark = 0xff;
  paVar6->toparraylen = 0;
  paVar6->toparray = (char **)0x0;
  paVar6->objects = 0;
  paVar6->totalmemory = 0;
  this->encshlist = paVar6;
  if (0 < arylen) {
    local_128 = (ulong)(uint)arylen;
    uVar9 = 0;
    do {
      local_170.tet = (tetrahedron *)0x0;
      local_118.iloc = scoutpoint(this,insertarray[uVar9],&local_170,local_184);
      pdVar3 = insertarray[uVar9];
      *(uint *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4) =
           *(byte *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4) | 0x800;
      local_180.sh = (shellface *)0x0;
      local_160.sh = (shellface *)0x0;
      if (local_118.iloc == 3) {
        if (local_170.tet[9] != (tetrahedron)0x0) {
          pdVar4 = local_170.tet[9][local_170.ver & 3];
          if (pdVar4 != (double *)0x0) {
            local_180.shver = tspivottbl[local_170.ver][(uint)pdVar4 & 7];
LAB_00149561:
            local_180.sh = (shellface *)((ulong)pdVar4 & 0xfffffffffffffff8);
            uVar8 = 0x700;
            goto LAB_0014956a;
          }
        }
      }
      else if (local_118.iloc == 4) {
        pppdVar7 = local_170.tet;
        uVar8 = local_170.ver;
        if ((local_170.tet[8] == (tetrahedron)0x0) ||
           (pdVar4 = local_170.tet[8][ver2edge[local_170.ver]], pdVar4 == (double *)0x0)) {
          do {
            if ((pppdVar7[9] != (tetrahedron)0x0) &&
               (pdVar4 = pppdVar7[9][uVar8 & 3], pdVar4 != (double *)0x0)) {
              local_180.shver = tspivottbl[(int)uVar8][(uint)pdVar4 & 7];
              goto LAB_00149561;
            }
            pppdVar2 = pppdVar7 + facepivot1[(int)uVar8];
            pppdVar7 = (tetrahedron *)((ulong)*pppdVar2 & 0xfffffffffffffff0);
            uVar8 = facepivot2[(int)uVar8][(uint)*pppdVar2 & 0xf];
          } while (local_170.tet != pppdVar7);
        }
        else {
          local_160.shver = (uint)pdVar4 & 7;
          local_160.sh = (shellface *)((ulong)pdVar4 & 0xfffffffffffffff8);
          uVar8 = 0x600;
LAB_0014956a:
          *(uint *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4) =
               *(byte *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4) | uVar8;
        }
      }
      iVar5 = insertpoint(this,pdVar3,&local_170,&local_180,&local_160,&local_118);
      if (iVar5 == 0) {
        *(uint *)((long)insertarray[uVar9] + (long)this->pointmarkindex * 4 + 4) =
             (uint)*(byte *)((long)insertarray[uVar9] + (long)this->pointmarkindex * 4 + 4);
        this->unuverts = this->unuverts + 1;
        this->encseglist->objects = 0;
        this->encshlist->objects = 0;
      }
      else {
        if (this->flipstack != (badface *)0x0) {
          lawsonflip3d(this,&local_a8);
          this->unflipqueue->objects = 0;
        }
        iVar5 = *(int *)((long)insertarray[uVar9] + (long)this->pointmarkindex * 4 + 4) >> 8;
        if (iVar5 == 7) {
          this->st_facref_count = this->st_facref_count + 1;
        }
        else if (iVar5 == 6) {
          this->st_segref_count = this->st_segref_count + 1;
        }
        else {
          this->st_volref_count = this->st_volref_count + 1;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_128);
  }
  paVar6 = this->encseglist;
  if (paVar6 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar6);
    operator_delete(paVar6,0x30);
  }
  paVar6 = this->encshlist;
  if (paVar6 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar6);
    operator_delete(paVar6,0x30);
  }
  if ((this->b->verbose != 0) &&
     (printf("  Inserted %ld (%ld, %ld, %ld) vertices.\n",
             (this->st_segref_count - (local_148 + local_150 + local_140)) + this->st_facref_count +
             this->st_volref_count,this->st_segref_count - local_150,
             this->st_facref_count - local_148,this->st_volref_count - local_140),
     0 < this->nonregularcount)) {
    printf("  Performed %ld brute-force searches.\n");
  }
  this->nonregularcount = local_130;
  this->samples = local_138;
  return;
}

Assistant:

void tetgenmesh::insertconstrainedpoints(point *insertarray, int arylen,
                                         int rejflag)
{
  triface searchtet, spintet;
  face splitsh;
  face splitseg;
  insertvertexflags ivf;
  flipconstraints fc;
  int randflag = 0;
  int t1ver;
  int i;

  if (b->verbose) {
    printf("  Inserting %d constrained points\n", arylen);
  }

  if (b->no_sort) { // -b/1 option.
    if (b->verbose) {
      printf("  Using the input order.\n"); 
    }
  } else {
    if (b->verbose) {
      printf("  Permuting vertices.\n"); 
    }
    point swappoint;
    int randindex;
    srand(arylen);
    for (i = 0; i < arylen; i++) {
      randindex = rand() % (i + 1); 
      swappoint = insertarray[i];
      insertarray[i] = insertarray[randindex];
      insertarray[randindex] = swappoint;
    }
    if (b->brio_hilbert) { // -b1 option
      if (b->verbose) {
        printf("  Sorting vertices.\n"); 
      }
      hilbert_init(in->mesh_dim);
      int ngroup = 0; 
      brio_multiscale_sort(insertarray, arylen, b->brio_threshold, 
                           b->brio_ratio, &ngroup);
    } else { // -b0 option.
      randflag = 1;
    } // if (!b->brio_hilbert)
  } // if (!b->no_sort)

  long bak_nonregularcount = nonregularcount;
  nonregularcount = 0l;
  long baksmaples = samples;
  samples = 3l; // Use at least 3 samples. Updated in randomsample().

  long bak_seg_count = st_segref_count;
  long bak_fac_count = st_facref_count;
  long bak_vol_count = st_volref_count;

  // Initialize the insertion parameters. 
  if (b->incrflip) { // -l option
    // Use incremental flip algorithm.
    ivf.bowywat = 0; 
    ivf.lawson = 1;
    ivf.validflag = 0; // No need to validate the cavity.
    fc.enqflag = 2;
  } else {
    // Use Bowyer-Watson algorithm.
    ivf.bowywat = 1; 
    ivf.lawson = 0;
    ivf.validflag = 1; // Validate the B-W cavity.
  }
  ivf.rejflag = rejflag;
  ivf.chkencflag = 0; 
  ivf.sloc = (int) INSTAR;
  ivf.sbowywat = 3; 
  ivf.splitbdflag = 1;
  ivf.respectbdflag = 1;
  ivf.assignmeshsize = b->metric;

  encseglist = new arraypool(sizeof(face), 8);
  encshlist = new arraypool(sizeof(badface), 8);

  // Insert the points.
  for (i = 0; i < arylen; i++) {
    // Find the location of the inserted point.
    // Do not use 'recenttet', since the mesh may be non-convex.
    searchtet.tet = NULL; 
    ivf.iloc = scoutpoint(insertarray[i], &searchtet, randflag);

    // Decide the right type for this point.
    setpointtype(insertarray[i], FREEVOLVERTEX); // Default.
    splitsh.sh = NULL;
    splitseg.sh = NULL;
    if (ivf.iloc == (int) ONEDGE) {
      if (issubseg(searchtet)) {
        tsspivot1(searchtet, splitseg);
        setpointtype(insertarray[i], FREESEGVERTEX);
        //ivf.rejflag = 0;
      } else {
        // Check if it is a subface edge.
        spintet = searchtet;
        while (1) {
          if (issubface(spintet)) {
            tspivot(spintet, splitsh);
            setpointtype(insertarray[i], FREEFACETVERTEX);
            //ivf.rejflag |= 1;
            break;
          }
          fnextself(spintet);
          if (spintet.tet == searchtet.tet) break;
        }
      }
    } else if (ivf.iloc == (int) ONFACE) {
      if (issubface(searchtet)) {
        tspivot(searchtet, splitsh);
        setpointtype(insertarray[i], FREEFACETVERTEX);
        //ivf.rejflag |= 1;
      }
    }

    // Now insert the point.
    if (insertpoint(insertarray[i], &searchtet, &splitsh, &splitseg, &ivf)) {
      if (flipstack != NULL) {
        // There are queued faces. Use flips to recover Delaunayness.
        lawsonflip3d(&fc);
        // There may be unflippable edges. Ignore them.
        unflipqueue->restart();
      }
      // Update the Steiner counters.
      if (pointtype(insertarray[i]) == FREESEGVERTEX) {
        st_segref_count++;
      } else if (pointtype(insertarray[i]) == FREEFACETVERTEX) {
        st_facref_count++;
      } else {
        st_volref_count++;
      }
    } else {
      // Point is not inserted.
      //pointdealloc(insertarray[i]);
      setpointtype(insertarray[i], UNUSEDVERTEX);
      unuverts++;
      encseglist->restart();
      encshlist->restart();
    }
  } // i

  delete encseglist;
  delete encshlist;

  if (b->verbose) {
    printf("  Inserted %ld (%ld, %ld, %ld) vertices.\n", 
           st_segref_count + st_facref_count + st_volref_count - 
           (bak_seg_count + bak_fac_count + bak_vol_count),
           st_segref_count - bak_seg_count, st_facref_count - bak_fac_count,
           st_volref_count - bak_vol_count);
    if (nonregularcount > 0l) {
      printf("  Performed %ld brute-force searches.\n", nonregularcount);
    }
  }

  nonregularcount = bak_nonregularcount;
  samples = baksmaples; 
}